

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus_allowed.c
# Opt level: O2

char * status_entry(char *key)

{
  int iVar1;
  FILE *__stream;
  __ssize_t _Var2;
  char *__s;
  size_t sVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  char *line;
  size_t line_n;
  
  line = (char *)0x0;
  line_n = 0;
  __stream = fopen("/proc/self/status","r");
  if (__stream == (FILE *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    do {
      do {
        _Var2 = getline(&line,&line_n,__stream);
        pcVar5 = line;
        if (_Var2 == -1) goto LAB_001d2d42;
        __s = strchr(line,0x3a);
      } while ((__s == (char *)0x0) || (*__s == '\0'));
      *__s = '\0';
      iVar1 = strcmp(line,key);
    } while (iVar1 != 0);
    do {
      do {
        pcVar5 = __s;
        __s = pcVar5 + 1;
        cVar4 = *__s;
      } while (cVar4 == ' ');
    } while (cVar4 == '\t');
    sVar3 = strlen(__s);
    pcVar6 = line;
    if (1 < sVar3) {
      pcVar5[sVar3] = '\0';
      cVar4 = *__s;
    }
    pcVar5 = line;
    if (cVar4 != '\0') {
      do {
        cVar4 = *__s;
        __s = __s + 1;
        pcVar5 = line + 1;
        *line = cVar4;
        line = pcVar5;
      } while (cVar4 != '\0');
      if (pcVar6 != (char *)0x0) goto LAB_001d2d4a;
    }
  }
LAB_001d2d42:
  free(pcVar5);
  pcVar6 = (char *)0x0;
LAB_001d2d4a:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return pcVar6;
}

Assistant:

static char *
status_entry(const char *key)
{
	char *result = NULL;
	char *line = NULL;
	size_t line_n = 0;
	FILE *fp;
	fp = fopen("/proc/self/status", "r");
	if (!fp)
		goto done;
	while (getline(&line, &line_n, fp) != -1) {
		char *v;
		v = strchr(line, ':');
		if (!v || *v == '\0')
			continue;
		*v = '\0';
		if (strcmp(line, key) != 0)
			continue;
		++v;
		while (*v == ' ' || *v == '\t')
			++v;
		if (strlen(v) > 1)
			v[strlen(v)-1] = '\0';
		if (*v == '\0')
			goto done;
		result = line;
		while ((*line++ = *v++))
			;
		goto done;
	}
done:
	if (!result)
		free(line);
	if (fp)
		fclose(fp);
	return result;
}